

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

int replace_existing(Curl_easy *data,Cookie *co,CookieInfo *ci,_Bool secure,_Bool *replacep)

{
  char *second;
  curl_trc_feat *pcVar1;
  int iVar2;
  size_t sVar3;
  Curl_llist_node *n;
  void *pvVar4;
  char *pcVar5;
  Cookie *co_00;
  bool bVar6;
  char *pcVar7;
  Curl_llist_node *n_00;
  bool bVar8;
  
  sVar3 = cookiehash(co->domain);
  n = Curl_llist_head(ci->cookielist + sVar3);
  if (n == (Curl_llist_node *)0x0) {
    bVar6 = false;
  }
  else {
    bVar6 = false;
    n_00 = (Curl_llist_node *)0x0;
    do {
      pvVar4 = Curl_node_elem(n);
      iVar2 = curl_strequal(*(char **)((long)pvVar4 + 0x40),co->name);
      if (iVar2 != 0) {
        pcVar7 = co->domain;
        if (*(char **)((long)pvVar4 + 0x60) == (char *)0x0) {
          if (pcVar7 == (char *)0x0) goto LAB_0011e77a;
        }
        else if ((pcVar7 != (char *)0x0) &&
                (iVar2 = curl_strequal(*(char **)((long)pvVar4 + 0x60),pcVar7), iVar2 != 0)) {
LAB_0011e77a:
          pcVar7 = *(char **)((long)pvVar4 + 0x58);
          if ((pcVar7 != (char *)0x0) &&
             (((second = co->spath, second != (char *)0x0 &&
               ((*(byte *)((long)pvVar4 + 0x74) & 2) != 0)) &&
              ((co->field_0x74 & 2) == 0 && !secure)))) {
            pcVar5 = strchr(pcVar7 + 1,0x2f);
            if (pcVar5 == (char *)0x0) {
              sVar3 = strlen(pcVar7);
            }
            else {
              sVar3 = (long)pcVar5 - (long)pcVar7;
            }
            iVar2 = curl_strnequal(pcVar7,second,sVar3);
            if (iVar2 != 0) {
              if (data == (Curl_easy *)0x0) {
                return 8;
              }
              if (((data->set).field_0x8cd & 0x10) == 0) {
                return 8;
              }
              pcVar1 = (data->state).feat;
              if ((pcVar1 != (curl_trc_feat *)0x0) && (pcVar1->log_level < 1)) {
                return 8;
              }
              Curl_infof(data,
                         "cookie \'%s\' for domain \'%s\' dropped, would overlay an existing cookie"
                         ,co->name,co->domain);
              return 8;
            }
          }
        }
      }
      if (n_00 == (Curl_llist_node *)0x0) {
        iVar2 = curl_strequal(*(char **)((long)pvVar4 + 0x40),co->name);
        if (iVar2 != 0) {
          pcVar7 = co->domain;
          if (*(char **)((long)pvVar4 + 0x60) == (char *)0x0) {
            bVar8 = pcVar7 == (char *)0x0;
LAB_0011e82b:
            if (bVar8) {
              bVar6 = true;
            }
          }
          else if ((pcVar7 != (char *)0x0) &&
                  (iVar2 = curl_strequal(*(char **)((long)pvVar4 + 0x60),pcVar7), iVar2 != 0)) {
            bVar8 = ((co->field_0x74 ^ *(byte *)((long)pvVar4 + 0x74)) & 1) == 0;
            goto LAB_0011e82b;
          }
          if (bVar6) {
            pcVar7 = co->spath;
            if (*(char **)((long)pvVar4 + 0x58) == (char *)0x0) {
              bVar8 = true;
            }
            else if (pcVar7 == (char *)0x0) {
              pcVar7 = (char *)0x0;
              bVar8 = false;
            }
            else {
              iVar2 = curl_strequal(*(char **)((long)pvVar4 + 0x58),pcVar7);
              if (iVar2 == 0) {
                bVar6 = false;
                n_00 = (Curl_llist_node *)0x0;
                goto LAB_0011e89d;
              }
              pcVar7 = co->spath;
              bVar8 = *(long *)((long)pvVar4 + 0x58) == 0;
            }
            if ((pcVar7 != (char *)0x0) == bVar8) {
              bVar6 = false;
            }
          }
          if (bVar6 != false) {
            n_00 = n;
            if (((co->field_0x74 & 4) == 0) && ((*(byte *)((long)pvVar4 + 0x74) & 4) != 0)) {
              return 0xf;
            }
            goto LAB_0011e89d;
          }
        }
        n_00 = (Curl_llist_node *)0x0;
      }
LAB_0011e89d:
      n = Curl_node_next(n);
    } while (n != (Curl_llist_node *)0x0);
    if (n_00 != (Curl_llist_node *)0x0) {
      co_00 = (Cookie *)Curl_node_elem(n_00);
      co->creationtime = co_00->creationtime;
      Curl_node_remove(n_00);
      freecookie(co_00);
    }
  }
  *replacep = bVar6;
  return 0;
}

Assistant:

static int
replace_existing(struct Curl_easy *data,
                 struct Cookie *co,
                 struct CookieInfo *ci,
                 bool secure,
                 bool *replacep)
{
  bool replace_old = FALSE;
  struct Curl_llist_node *replace_n = NULL;
  struct Curl_llist_node *n;
  size_t myhash = cookiehash(co->domain);
  for(n = Curl_llist_head(&ci->cookielist[myhash]); n; n = Curl_node_next(n)) {
    struct Cookie *clist = Curl_node_elem(n);
    if(strcasecompare(clist->name, co->name)) {
      /* the names are identical */
      bool matching_domains = FALSE;

      if(clist->domain && co->domain) {
        if(strcasecompare(clist->domain, co->domain))
          /* The domains are identical */
          matching_domains = TRUE;
      }
      else if(!clist->domain && !co->domain)
        matching_domains = TRUE;

      if(matching_domains && /* the domains were identical */
         clist->spath && co->spath && /* both have paths */
         clist->secure && !co->secure && !secure) {
        size_t cllen;
        const char *sep;

        /*
         * A non-secure cookie may not overlay an existing secure cookie.
         * For an existing cookie "a" with path "/login", refuse a new
         * cookie "a" with for example path "/login/en", while the path
         * "/loginhelper" is ok.
         */

        sep = strchr(clist->spath + 1, '/');

        if(sep)
          cllen = sep - clist->spath;
        else
          cllen = strlen(clist->spath);

        if(strncasecompare(clist->spath, co->spath, cllen)) {
          infof(data, "cookie '%s' for domain '%s' dropped, would "
                "overlay an existing cookie", co->name, co->domain);
          return CERR_BAD_SECURE;
        }
      }
    }

    if(!replace_n && strcasecompare(clist->name, co->name)) {
      /* the names are identical */

      if(clist->domain && co->domain) {
        if(strcasecompare(clist->domain, co->domain) &&
          (clist->tailmatch == co->tailmatch))
          /* The domains are identical */
          replace_old = TRUE;
      }
      else if(!clist->domain && !co->domain)
        replace_old = TRUE;

      if(replace_old) {
        /* the domains were identical */

        if(clist->spath && co->spath &&
           !strcasecompare(clist->spath, co->spath))
          replace_old = FALSE;
        else if(!clist->spath != !co->spath)
          replace_old = FALSE;
      }

      if(replace_old && !co->livecookie && clist->livecookie) {
        /*
         * Both cookies matched fine, except that the already present cookie
         * is "live", which means it was set from a header, while the new one
         * was read from a file and thus is not "live". "live" cookies are
         * preferred so the new cookie is freed.
         */
        return CERR_LIVE_WINS;
      }
      if(replace_old)
        replace_n = n;
    }
  }
  if(replace_n) {
    struct Cookie *repl = Curl_node_elem(replace_n);

    /* when replacing, creationtime is kept from old */
    co->creationtime = repl->creationtime;

    /* unlink the old */
    Curl_node_remove(replace_n);

    /* free the old cookie */
    freecookie(repl);
  }
  *replacep = replace_old;
  return CERR_OK;
}